

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,std::pair<unsigned_long,bool>>::
     transfer<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
  ::emplace((slot_type *)0x1464ac);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
  ::
  construct<std::pair<std::__cxx11::string,std::pair<unsigned_long,bool>>,std::pair<std::__cxx11::string,std::pair<unsigned_long,bool>>>
            (in_RSI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
                     *)&in_RDX->value,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
              *)0x1464bf);
  destroy<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,bool>>>>
            (in_RSI,in_RDX);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}